

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kv_instance.cc
# Opt level: O2

stale_header_info fdb_get_smallest_active_header(fdb_kvs_handle *handle)

{
  avl_node **__lock;
  filemgr *pfVar1;
  long lVar2;
  char *bid;
  fdb_seqnum_t fVar3;
  avl_node *paVar4;
  avl_node *paVar5;
  avl_node *paVar6;
  avl_node *paVar7;
  char *pcVar8;
  avl_node *paVar9;
  size_t sVar10;
  stale_header_info sVar11;
  long alStack_d0 [9];
  undefined1 auStack_88 [8];
  bid_t local_80;
  uint64_t dummy64;
  char *new_filename;
  bid_t last_wal_bid;
  filemgr_magic_t magic;
  fdb_seqnum_t seqnum;
  avl_node *local_50;
  size_t local_48;
  size_t hdr_len;
  avl_node *local_38;
  
  lVar2 = -((ulong)(handle->config).blocksize + 0xf & 0xfffffffffffffff0);
  seqnum = (fdb_seqnum_t)(auStack_88 + lVar2);
  paVar7 = (avl_node *)
           (handle->fhandle->root->cur_header_revnum).super___atomic_base<unsigned_long>._M_i;
  local_38 = (avl_node *)
             (handle->fhandle->root->last_hdr_bid).super___atomic_base<unsigned_long>._M_i;
  pfVar1 = handle->file;
  *(undefined8 *)((long)alStack_d0 + lVar2 + 0x40) = 0x14461d;
  pthread_spin_lock(&pfVar1->fhandle_idx_lock);
  pfVar1 = handle->file;
  *(undefined8 *)((long)alStack_d0 + lVar2 + 0x40) = 0x14462b;
  paVar4 = avl_first(&pfVar1->fhandle_idx);
  local_50 = paVar7;
  while (paVar4 != (avl_node *)0x0) {
    *(undefined8 *)((long)alStack_d0 + lVar2 + 0x40) = 0x14463f;
    paVar5 = avl_next(paVar4);
    paVar4 = paVar4[-1].right;
    __lock = &paVar4[1].left;
    *(undefined8 *)((long)alStack_d0 + lVar2 + 0x40) = 0x144652;
    pthread_spin_lock((pthread_spinlock_t *)__lock);
    paVar4 = paVar4->left->parent;
    while (paVar9 = paVar4, paVar9 != (avl_node *)0x0) {
      paVar4 = paVar9->left;
      if ((paVar9[-1].right[0x11].right != (avl_node *)0x0) &&
         (paVar9[-1].right[0x10].parent < paVar7)) {
        paVar7 = paVar9[-1].right[0x10].parent;
        local_38 = paVar9[-1].right[0x10].right;
      }
    }
    *(undefined8 *)((long)alStack_d0 + lVar2 + 0x40) = 0x1446a3;
    pthread_spin_unlock((pthread_spinlock_t *)__lock);
    paVar4 = paVar5;
  }
  pfVar1 = handle->file;
  *(undefined8 *)((long)alStack_d0 + lVar2 + 0x40) = 0x1446b6;
  pthread_spin_unlock(&pfVar1->fhandle_idx_lock);
  paVar4 = (avl_node *)
           (handle->file->config->num_keeping_headers).super___atomic_base<unsigned_long>._M_i;
  paVar5 = local_38;
  if (paVar4 != (avl_node *)0x0) {
    if (local_38 == (avl_node *)(handle->last_hdr_bid).super___atomic_base<unsigned_long>._M_i) {
      paVar5 = (avl_node *)(handle->file->header).bid.super___atomic_base<unsigned_long>._M_i;
      paVar7 = (avl_node *)((handle->file->header).revnum - 1);
    }
    hdr_len = (size_t)paVar7;
    local_50 = (avl_node *)((long)local_50 - (long)paVar7);
    paVar7 = local_50;
    if (paVar4 < local_50) {
      paVar7 = paVar4;
    }
    paVar9 = (avl_node *)((long)&paVar7[-1].right + 7);
    paVar7 = local_38;
    do {
      paVar6 = paVar7;
      fVar3 = seqnum;
      paVar9 = (avl_node *)((long)&paVar9->parent + 1);
      if (paVar4 == paVar9) break;
      pfVar1 = handle->file;
      *(err_log_callback **)((long)alStack_d0 + lVar2 + 0x40) = &handle->log_callback;
      *(undefined8 *)((long)alStack_d0 + lVar2 + 0x38) = 0;
      *(bid_t **)((long)alStack_d0 + lVar2 + 0x30) = &last_wal_bid;
      *(undefined8 *)((long)alStack_d0 + lVar2 + 0x28) = 0;
      *(undefined8 *)((long)alStack_d0 + lVar2 + 0x20) = 0x144752;
      paVar5 = (avl_node *)
               filemgr_fetch_prev_header
                         (pfVar1,(uint64_t)paVar5,(void *)fVar3,&local_48,&magic,&hdr_len,
                          *(uint64_t **)((long)alStack_d0 + lVar2 + 0x28),
                          *(uint64_t **)((long)alStack_d0 + lVar2 + 0x30),
                          *(uint64_t **)((long)alStack_d0 + lVar2 + 0x38),
                          *(err_log_callback **)((long)alStack_d0 + lVar2 + 0x40));
      paVar7 = paVar5;
    } while (local_48 != 0);
    if (local_50 < paVar4) {
      paVar5 = paVar6;
    }
  }
  paVar7 = (avl_node *)(handle->last_hdr_bid).super___atomic_base<unsigned_long>._M_i;
  pfVar1 = handle->file;
  *(undefined8 *)((long)alStack_d0 + lVar2 + 0x40) = 0xffffffffffffffff;
  fVar3 = seqnum;
  pcVar8 = *(char **)((long)alStack_d0 + lVar2 + 0x40);
  if (paVar5 == paVar7) {
    sVar10 = 0;
    *(undefined8 *)((long)alStack_d0 + lVar2 + 0x40) = 0x1447ac;
    filemgr_get_header(pfVar1,(void *)fVar3,&local_48,(bid_t *)0x0,&magic,&hdr_len);
    if (local_48 == 0) goto LAB_0014485f;
  }
  else {
    *(err_log_callback **)((long)alStack_d0 + lVar2 + 0x40) = &handle->log_callback;
    *(undefined8 *)((long)alStack_d0 + lVar2 + 0x38) = 0;
    *(bid_t **)((long)alStack_d0 + lVar2 + 0x30) = &last_wal_bid;
    *(undefined8 *)((long)alStack_d0 + lVar2 + 0x28) = 0;
    *(undefined8 *)((long)alStack_d0 + lVar2 + 0x20) = 0x1447e7;
    filemgr_fetch_header
              (pfVar1,(uint64_t)paVar5,(void *)fVar3,&local_48,&magic,&hdr_len,
               *(uint64_t **)((long)alStack_d0 + lVar2 + 0x28),
               *(uint64_t **)((long)alStack_d0 + lVar2 + 0x30),
               *(uint64_t **)((long)alStack_d0 + lVar2 + 0x38),
               *(err_log_callback **)((long)alStack_d0 + lVar2 + 0x40));
  }
  *(undefined8 *)((long)alStack_d0 + lVar2 + 0x40) = 0;
  *(uint64_t **)((long)alStack_d0 + lVar2 + 0x38) = &dummy64;
  *(bid_t **)((long)alStack_d0 + lVar2 + 0x30) = &local_80;
  *(bid_t **)((long)alStack_d0 + lVar2 + 0x28) = &local_80;
  *(char ***)((long)alStack_d0 + lVar2 + 0x20) = &new_filename;
  *(bid_t **)((long)alStack_d0 + lVar2 + 0x18) = &local_80;
  *(bid_t **)((long)alStack_d0 + lVar2 + 0x10) = &local_80;
  *(bid_t **)((long)alStack_d0 + lVar2 + 8) = &local_80;
  *(undefined8 *)((long)alStack_d0 + lVar2) = 0x144815;
  fdb_fetch_header(last_wal_bid,(void *)fVar3,&local_80,&local_80,&local_80,&local_80,
                   *(uint64_t **)((long)alStack_d0 + lVar2 + 8),
                   *(uint64_t **)((long)alStack_d0 + lVar2 + 0x10),
                   *(uint64_t **)((long)alStack_d0 + lVar2 + 0x18),
                   *(uint64_t **)((long)alStack_d0 + lVar2 + 0x20),
                   *(uint64_t **)((long)alStack_d0 + lVar2 + 0x28),
                   *(uint64_t **)((long)alStack_d0 + lVar2 + 0x30),
                   *(char ***)((long)alStack_d0 + lVar2 + 0x38),
                   *(char ***)((long)alStack_d0 + lVar2 + 0x40));
  bid = new_filename;
  if (new_filename == (char *)0xffffffffffffffff) {
    sVar10 = 0;
  }
  else {
    pfVar1 = handle->file;
    *(err_log_callback **)((long)alStack_d0 + lVar2 + 0x40) = &handle->log_callback;
    *(undefined8 *)((long)alStack_d0 + lVar2 + 0x38) = 0;
    *(bid_t **)((long)alStack_d0 + lVar2 + 0x30) = &last_wal_bid;
    *(undefined8 *)((long)alStack_d0 + lVar2 + 0x28) = 0;
    *(undefined8 *)((long)alStack_d0 + lVar2 + 0x20) = 0x14484f;
    filemgr_fetch_header
              (pfVar1,(uint64_t)bid,(void *)fVar3,&local_48,&magic,&hdr_len,
               *(uint64_t **)((long)alStack_d0 + lVar2 + 0x28),
               *(uint64_t **)((long)alStack_d0 + lVar2 + 0x30),
               *(uint64_t **)((long)alStack_d0 + lVar2 + 0x38),
               *(err_log_callback **)((long)alStack_d0 + lVar2 + 0x40));
    pcVar8 = new_filename;
    sVar10 = hdr_len;
  }
LAB_0014485f:
  sVar11.bid = (bid_t)pcVar8;
  sVar11.revnum = sVar10;
  return sVar11;
}

Assistant:

stale_header_info fdb_get_smallest_active_header(fdb_kvs_handle *handle)
{
    uint8_t *hdr_buf = alca(uint8_t, handle->config.blocksize);
    size_t i, hdr_len;
    uint64_t n_headers;
    bid_t hdr_bid, last_wal_bid;
    filemgr_header_revnum_t hdr_revnum;
    filemgr_header_revnum_t cur_revnum;
    filemgr_magic_t magic;
    fdb_seqnum_t seqnum;
    fdb_file_handle *fhandle = NULL;
    stale_header_info ret;
    struct avl_node *a;
    struct filemgr_fhandle_idx_node *fhandle_node;
    struct list_elem *e;
    struct kvs_opened_node *item;

    ret.revnum = cur_revnum = handle->fhandle->root->cur_header_revnum;
    ret.bid = handle->fhandle->root->last_hdr_bid;

    spin_lock(&handle->file->fhandle_idx_lock);

    // check all opened file handles
    a = avl_first(&handle->file->fhandle_idx);
    while (a) {
        fhandle_node = _get_entry(a, struct filemgr_fhandle_idx_node, avl);
        a = avl_next(a);

        fhandle = (fdb_file_handle*)fhandle_node->fhandle;
        spin_lock(&fhandle->lock);
        // check all opened KVS handles belonging to the file handle
        e = list_begin(fhandle->handles);
        while (e) {

            item = _get_entry(e, struct kvs_opened_node, le);
            e = list_next(e);

            if (!item->handle->shandle) {
                // Only consider active snapshot handles since non-snapshot
                // handles will get synced upon their next forestdb api call.
                // This prevents "lazy" non-snapshot handles from holding up
                // stale block reclaim.
                continue;
            }

            if (item->handle->cur_header_revnum < ret.revnum) {
                ret.revnum = item->handle->cur_header_revnum;
                ret.bid = item->handle->last_hdr_bid;
            }
        }
        spin_unlock(&fhandle->lock);
    }

    spin_unlock(&handle->file->fhandle_idx_lock);

    uint64_t num_keeping_headers =
        atomic_get_uint64_t(&handle->file->config->num_keeping_headers,
                            std::memory_order_relaxed);
    if (num_keeping_headers) {
        // backward scan previous header info to keep more headers

        if (ret.bid == handle->last_hdr_bid) {
            // header in 'handle->last_hdr_bid' is not written into file yet!
            // we should start from the previous header
            hdr_bid = atomic_get_uint64_t(&handle->file->header.bid);
            hdr_revnum = handle->file->header.revnum - 1;
        } else {
            hdr_bid = ret.bid;
            hdr_revnum = ret.revnum;
        }

        n_headers= num_keeping_headers;
        if (cur_revnum - hdr_revnum < n_headers) {
            n_headers = n_headers - (cur_revnum - hdr_revnum);
        } else {
            n_headers = 0;
        }

        for (i=0; i<n_headers; ++i) {
            hdr_bid = filemgr_fetch_prev_header(handle->file, hdr_bid,
                         hdr_buf, &hdr_len, &seqnum, &hdr_revnum, NULL,
                         &magic, NULL, &handle->log_callback);
            if (hdr_len) {
                ret.revnum = hdr_revnum;
                ret.bid = hdr_bid;
            } else {
                break;
            }
        }
        if (!n_headers) {
            ret.bid = hdr_bid;
            ret.revnum = hdr_revnum;
        }
    }

    // although we keep more headers from the oldest active header, we have to
    // preserve the last WAL flushing header from the target header for data
    // consistency.
    uint64_t dummy64;
    char *new_filename;

    if (ret.bid == handle->last_hdr_bid) {
        // The latest header (that is not written yet) is the
        // only one that we can reclaim. Read from memory.
        filemgr_get_header(handle->file, hdr_buf, &hdr_len, NULL, &seqnum, &hdr_revnum);
        if (!hdr_len) {
            ret.bid = BLK_NOT_FOUND;
            ret.revnum = 0;
            return ret;
        }
    } else {
        filemgr_fetch_header(handle->file, ret.bid, hdr_buf, &hdr_len, &seqnum,
                             &hdr_revnum, NULL, &magic, NULL, &handle->log_callback);
    }
    fdb_fetch_header(magic, hdr_buf, &dummy64, &dummy64, &dummy64, &dummy64,
                     &dummy64, &dummy64, &dummy64, &last_wal_bid, &dummy64,
                     &dummy64, &new_filename, NULL);

    if (last_wal_bid != BLK_NOT_FOUND) {
        filemgr_fetch_header(handle->file, last_wal_bid, hdr_buf, &hdr_len, &seqnum,
                             &hdr_revnum, NULL, &magic, NULL, &handle->log_callback);
        ret.bid = last_wal_bid;
        ret.revnum = hdr_revnum;
    } else {
        // WAL has not been flushed yet .. we cannot trigger block reusing
        ret.bid = BLK_NOT_FOUND;
        ret.revnum = 0;
    }

    return ret;
}